

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::WriteMakeRule
          (cmLocalUnixMakefileGenerator3 *this,ostream *os,char *comment,string *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *commands,bool symbolic,bool in_help)

{
  cmMakefile *this_00;
  pointer pbVar1;
  cmLocalUnixMakefileGenerator3 *this_01;
  bool bVar2;
  long lVar3;
  ostream *poVar4;
  string *psVar5;
  char *pcVar6;
  char *pcVar7;
  pointer pbVar8;
  allocator<char> local_113;
  allocator<char> local_112;
  allocator<char> local_111;
  cmLocalUnixMakefileGenerator3 *local_110;
  string binDir;
  string tgt;
  string replace;
  string local_90;
  string local_70;
  string local_50;
  
  local_110 = this;
  if (target->_M_string_length != 0) {
    replace._M_dataplus._M_p = (pointer)&replace.field_2;
    replace._M_string_length = 0;
    replace.field_2._M_local_buf[0] = '\0';
    if (comment != (char *)0x0) {
      std::__cxx11::string::assign((char *)&replace);
      while( true ) {
        lVar3 = std::__cxx11::string::find((char)&replace,10);
        if (lVar3 == -1) break;
        poVar4 = std::operator<<(os,"# ");
        std::__cxx11::string::substr((ulong)&tgt,(ulong)&replace);
        poVar4 = std::operator<<(poVar4,(string *)&tgt);
        std::operator<<(poVar4,"\n");
        std::__cxx11::string::~string((string *)&tgt);
      }
      poVar4 = std::operator<<(os,"# ");
      std::__cxx11::string::substr((ulong)&tgt,(ulong)&replace);
      poVar4 = std::operator<<(poVar4,(string *)&tgt);
      std::operator<<(poVar4,"\n");
      std::__cxx11::string::~string((string *)&tgt);
    }
    this_01 = local_110;
    psVar5 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)local_110);
    cmLocalGenerator::MaybeConvertToRelativePath(&binDir,(cmLocalGenerator *)this_01,psVar5,target);
    cmSystemTools::ConvertToOutputPath(&tgt,&binDir);
    std::__cxx11::string::~string((string *)&binDir);
    pcVar7 = "";
    if (tgt._M_string_length == 1) {
      pcVar7 = " ";
    }
    if (symbolic) {
      this_00 = (local_110->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&binDir,"CMAKE_MAKE_SYMBOLIC_RULE",(allocator<char> *)&local_70);
      pcVar6 = cmMakefile::GetDefinition(this_00,&binDir);
      std::__cxx11::string::~string((string *)&binDir);
      if (pcVar6 != (char *)0x0) {
        binDir._M_dataplus = tgt._M_dataplus;
        poVar4 = operator<<(os,(cmMakeSafe *)&binDir);
        poVar4 = std::operator<<(poVar4,pcVar7);
        poVar4 = std::operator<<(poVar4,": ");
        poVar4 = std::operator<<(poVar4,pcVar6);
        std::operator<<(poVar4,"\n");
      }
    }
    if ((depends->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start ==
        (depends->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      binDir._M_dataplus = tgt._M_dataplus;
      poVar4 = operator<<(os,(cmMakeSafe *)&binDir);
      poVar4 = std::operator<<(poVar4,pcVar7);
      std::operator<<(poVar4,":\n");
    }
    else {
      psVar5 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)local_110);
      std::__cxx11::string::string((string *)&binDir,(string *)psVar5);
      pbVar1 = (depends->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar8 = (depends->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar1;
          pbVar8 = pbVar8 + 1) {
        std::__cxx11::string::_M_assign((string *)&replace);
        cmLocalGenerator::MaybeConvertToRelativePath
                  (&local_90,(cmLocalGenerator *)local_110,&binDir,&replace);
        cmSystemTools::ConvertToOutputPath(&local_70,&local_90);
        std::__cxx11::string::operator=((string *)&replace,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
        local_70._M_dataplus._M_p = tgt._M_dataplus._M_p;
        poVar4 = operator<<(os,(cmMakeSafe *)&local_70);
        poVar4 = std::operator<<(poVar4,pcVar7);
        poVar4 = std::operator<<(poVar4,": ");
        local_90._M_dataplus._M_p = replace._M_dataplus._M_p;
        poVar4 = operator<<(poVar4,(cmMakeSafe *)&local_90);
        std::operator<<(poVar4,"\n");
      }
      std::__cxx11::string::~string((string *)&binDir);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"\t",&local_111);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_112);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"\n",&local_113);
    cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&binDir,&local_70,commands,&local_90,&local_50);
    poVar4 = std::operator<<(os,(string *)&binDir);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string((string *)&binDir);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    if (symbolic) {
      bVar2 = cmLocalGenerator::IsWatcomWMake((cmLocalGenerator *)local_110);
      if (!bVar2) {
        poVar4 = std::operator<<(os,".PHONY : ");
        binDir._M_dataplus = tgt._M_dataplus;
        poVar4 = operator<<(poVar4,(cmMakeSafe *)&binDir);
        std::operator<<(poVar4,"\n");
      }
    }
    std::operator<<(os,"\n");
    if (in_help) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_110->LocalHelp,target);
    }
    std::__cxx11::string::~string((string *)&tgt);
    std::__cxx11::string::~string((string *)&replace);
    return;
  }
  cmSystemTools::Error
            ("No target for WriteMakeRule! called with comment: ",comment,(char *)0x0,(char *)0x0);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteMakeRule(
  std::ostream& os, const char* comment, const std::string& target,
  const std::vector<std::string>& depends,
  const std::vector<std::string>& commands, bool symbolic, bool in_help)
{
  // Make sure there is a target.
  if (target.empty()) {
    cmSystemTools::Error("No target for WriteMakeRule! called with comment: ",
                         comment);
    return;
  }

  std::string replace;

  // Write the comment describing the rule in the makefile.
  if (comment) {
    replace = comment;
    std::string::size_type lpos = 0;
    std::string::size_type rpos;
    while ((rpos = replace.find('\n', lpos)) != std::string::npos) {
      os << "# " << replace.substr(lpos, rpos - lpos) << "\n";
      lpos = rpos + 1;
    }
    os << "# " << replace.substr(lpos) << "\n";
  }

  // Construct the left hand side of the rule.
  std::string tgt = cmSystemTools::ConvertToOutputPath(
    this->MaybeConvertToRelativePath(this->GetBinaryDirectory(), target));

  const char* space = "";
  if (tgt.size() == 1) {
    // Add a space before the ":" to avoid drive letter confusion on
    // Windows.
    space = " ";
  }

  // Mark the rule as symbolic if requested.
  if (symbolic) {
    if (const char* sym =
          this->Makefile->GetDefinition("CMAKE_MAKE_SYMBOLIC_RULE")) {
      os << cmMakeSafe(tgt) << space << ": " << sym << "\n";
    }
  }

  // Write the rule.
  if (depends.empty()) {
    // No dependencies.  The commands will always run.
    os << cmMakeSafe(tgt) << space << ":\n";
  } else {
    // Split dependencies into multiple rule lines.  This allows for
    // very long dependency lists even on older make implementations.
    std::string binDir = this->GetBinaryDirectory();
    for (std::string const& depend : depends) {
      replace = depend;
      replace = cmSystemTools::ConvertToOutputPath(
        this->MaybeConvertToRelativePath(binDir, replace));
      os << cmMakeSafe(tgt) << space << ": " << cmMakeSafe(replace) << "\n";
    }
  }

  // Write the list of commands.
  os << cmWrap("\t", commands, "", "\n") << "\n";
  if (symbolic && !this->IsWatcomWMake()) {
    os << ".PHONY : " << cmMakeSafe(tgt) << "\n";
  }
  os << "\n";
  // Add the output to the local help if requested.
  if (in_help) {
    this->LocalHelp.push_back(target);
  }
}